

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::
JsonIntRangeSetValReqBase(JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *this)

{
  Sp local_50;
  optional<unsigned_long_long> local_38;
  unsigned_long_long local_28;
  optional<unsigned_long_long> local_20;
  JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *local_10;
  JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *this_local;
  
  local_28 = 1;
  local_10 = this;
  boost::optional<unsigned_long_long>::optional(&local_20,&local_28);
  boost::optional<unsigned_long_long>::optional();
  JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>::shared();
  JsonArrayValReq::JsonArrayValReq(&this->super_JsonArrayValReq,&local_20,&local_38,&local_50);
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr(&local_50);
  (this->super_JsonArrayValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonIntRangeSetValReqBase_007df870;
  return;
}

Assistant:

explicit JsonIntRangeSetValReqBase() :
        JsonArrayValReq {1, boost::none, JsonIntRangeValReqBase<JsonIntValReqT>::shared()}
    {
    }